

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int subjournalPage(PgHdr *pPg)

{
  Pager *pPager;
  sqlite3_file *psVar1;
  void *pvVar2;
  int iVar3;
  MemJournal *p;
  long offset;
  
  pPager = pPg->pPager;
  if (pPager->journalMode != '\x02') {
    psVar1 = pPager->sjfd;
    if (psVar1->pMethods == (sqlite3_io_methods *)0x0) {
      if ((pPager->journalMode == '\x04') || (pPager->subjInMemory != '\0')) {
        psVar1[5].pMethods = (sqlite3_io_methods *)0x0;
        psVar1[3].pMethods = (sqlite3_io_methods *)0x0;
        psVar1[4].pMethods = (sqlite3_io_methods *)0x0;
        psVar1[1].pMethods = (sqlite3_io_methods *)0x0;
        psVar1[2].pMethods = (sqlite3_io_methods *)0x0;
        psVar1->pMethods = &MemJournalMethods;
      }
      else {
        iVar3 = (*pPager->pVfs->xOpen)(pPager->pVfs,(char *)0x0,psVar1,0x201e,(int *)0x0);
        if (iVar3 != 0) {
          return iVar3;
        }
      }
    }
    pvVar2 = pPg->pData;
    offset = ((long)pPager->pageSize + 4) * (ulong)pPager->nSubRec;
    iVar3 = write32bits(pPager->sjfd,offset,pPg->pgno);
    if ((iVar3 != 0) ||
       (iVar3 = (*pPager->sjfd->pMethods->xWrite)(pPager->sjfd,pvVar2,pPager->pageSize,offset + 4),
       iVar3 != 0)) {
      return iVar3;
    }
  }
  pPager->nSubRec = pPager->nSubRec + 1;
  iVar3 = addToSavepointBitvecs(pPager,pPg->pgno);
  return iVar3;
}

Assistant:

static int subjournalPage(PgHdr *pPg){
  int rc = SQLITE_OK;
  Pager *pPager = pPg->pPager;
  if( pPager->journalMode!=PAGER_JOURNALMODE_OFF ){

    /* Open the sub-journal, if it has not already been opened */
    assert( pPager->useJournal );
    assert( isOpen(pPager->jfd) || pagerUseWal(pPager) );
    assert( isOpen(pPager->sjfd) || pPager->nSubRec==0 );
    assert( pagerUseWal(pPager) 
         || pageInJournal(pPg) 
         || pPg->pgno>pPager->dbOrigSize 
    );
    rc = openSubJournal(pPager);

    /* If the sub-journal was opened successfully (or was already open),
    ** write the journal record into the file.  */
    if( rc==SQLITE_OK ){
      void *pData = pPg->pData;
      i64 offset = (i64)pPager->nSubRec*(4+pPager->pageSize);
      char *pData2;
  
      CODEC2(pPager, pData, pPg->pgno, 7, return SQLITE_NOMEM, pData2);
      PAGERTRACE(("STMT-JOURNAL %d page %d\n", PAGERID(pPager), pPg->pgno));
      rc = write32bits(pPager->sjfd, offset, pPg->pgno);
      if( rc==SQLITE_OK ){
        rc = sqlite3OsWrite(pPager->sjfd, pData2, pPager->pageSize, offset+4);
      }
    }
  }
  if( rc==SQLITE_OK ){
    pPager->nSubRec++;
    assert( pPager->nSavepoint>0 );
    rc = addToSavepointBitvecs(pPager, pPg->pgno);
  }
  return rc;
}